

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_defined_units.cpp
# Opt level: O2

void __thiscall
unitStringDefinitions_combinedDuplicates_Test::~unitStringDefinitions_combinedDuplicates_Test
          (unitStringDefinitions_combinedDuplicates_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(unitStringDefinitions, combinedDuplicates)
{
    std::map<std::string, units::precise_unit> testMap;
    for (const auto& ustring : units::defined_unit_strings_si) {
        if (ustring.first == nullptr) {
            continue;
        }
        auto res = testMap.emplace(ustring.first, ustring.second);
        EXPECT_TRUE(res.second) << "duplicate si unit string " << ustring.first;
    }

    for (std::size_t ii = 0; ii < units::defined_unit_strings_customary.size();
         ++ii) {
        if (units::defined_unit_strings_customary[ii].first == nullptr) {
            continue;
        }
        auto res = testMap.emplace(
            units::defined_unit_strings_customary[ii].first,
            units::defined_unit_strings_customary[ii].second);
        EXPECT_TRUE(res.second)
            << "duplicate unit string " << ii << " "
            << units::defined_unit_strings_customary[ii].first;
    }
#if !defined(UNITS_DISABLE_NON_ENGLISH_UNITS) ||                               \
    UNITS_DISABLE_NON_ENGLISH_UNITS == 0
    for (std::size_t ii = 0;
         ii < units::defined_unit_strings_non_english.size();
         ++ii) {
        if (units::defined_unit_strings_non_english[ii].first == nullptr) {
            continue;
        }
        auto res = testMap.emplace(
            units::defined_unit_strings_non_english[ii].first,
            units::defined_unit_strings_non_english[ii].second);
        EXPECT_TRUE(res.second)
            << "duplicate non english unit string " << ii << " "
            << units::defined_unit_strings_non_english[ii].first;
    }
#endif
}